

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O0

void glfwInitHint(int hint,int value)

{
  GLFWbool GVar1;
  GLFWbool GVar2;
  GLFWbool GVar3;
  GLFWbool in_ESI;
  uint in_EDI;
  
  GVar1 = in_ESI;
  GVar2 = _glfwInitHints.ns.menubar;
  GVar3 = _glfwInitHints.ns.chdir;
  if (((in_EDI != 0x50001) && (GVar1 = _glfwInitHints.hatButtons, GVar3 = in_ESI, in_EDI != 0x51001)
      ) && (GVar2 = in_ESI, GVar3 = _glfwInitHints.ns.chdir, in_EDI != 0x51002)) {
    _glfwInputError(0x10003,"Invalid init hint 0x%08X",(ulong)in_EDI);
    GVar1 = _glfwInitHints.hatButtons;
    GVar2 = _glfwInitHints.ns.menubar;
    GVar3 = _glfwInitHints.ns.chdir;
  }
  _glfwInitHints.ns.chdir = GVar3;
  _glfwInitHints.ns.menubar = GVar2;
  _glfwInitHints.hatButtons = GVar1;
  return;
}

Assistant:

GLFWAPI void glfwInitHint(int hint, int value)
{
    switch (hint)
    {
        case GLFW_JOYSTICK_HAT_BUTTONS:
            _glfwInitHints.hatButtons = value;
            return;
        case GLFW_COCOA_CHDIR_RESOURCES:
            _glfwInitHints.ns.chdir = value;
            return;
        case GLFW_COCOA_MENUBAR:
            _glfwInitHints.ns.menubar = value;
            return;
    }

    _glfwInputError(GLFW_INVALID_ENUM,
                    "Invalid init hint 0x%08X", hint);
}